

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  bool bVar7;
  double dVar8;
  double ce [4];
  double roots [4];
  char local_89;
  double local_88;
  undefined8 uStack_80;
  double local_78 [9];
  
  testEigen();
  local_78[2] = -1.87832;
  local_78[3] = -0.882024;
  local_78[0] = 1.87832;
  local_78[1] = -0.0950376;
  uVar4 = 5;
  if ((uint)argc < 5) {
    uVar4 = (ulong)(uint)argc;
  }
  if (1 < (uint)argc) {
    lVar5 = 0;
    do {
      dVar1 = strtod(argv[lVar5 + 1],(char **)0x0);
      local_78[lVar5] = dVar1;
      lVar5 = lVar5 + 1;
    } while (uVar4 - 1 != lVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x^4",3);
  uVar2 = 4;
  if (argc != 1) {
    uVar2 = (int)uVar4 - 1;
  }
  if (uVar2 != 0) {
    local_88 = (double)CONCAT44(local_88._4_4_,uVar2);
    pdVar6 = local_78;
    lVar5 = 3;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + (",4);
      poVar3 = std::ostream::_M_insert<double>(*pdVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," =0\n",4);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*x^",3);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      pdVar6 = pdVar6 + 1;
    } while ((ulong)uVar2 + lVar5 != 3);
    if (local_88._0_4_ == 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cubic:\n",7);
      uVar2 = cubicSolver(local_78,local_78 + 4);
      goto LAB_0010aaeb;
    }
    if (local_88._0_4_ == 4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quadratic:\n",0xb);
      uVar2 = quarticSolver(local_78,local_78 + 4);
      goto LAB_0010aaeb;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quartic:\n",9);
  dVar1 = local_78[0] * 0.25 * local_78[0] - local_78[1];
  uVar2 = 0;
  if (0.0 <= dVar1) {
    if (dVar1 < 0.0) {
      local_88 = local_78[0];
      uStack_80 = 0;
      dVar1 = sqrt(dVar1);
      dVar8 = local_88;
    }
    else {
      dVar1 = SQRT(dVar1);
      dVar8 = local_78[0];
    }
    local_78[4] = dVar8 * -0.5 + dVar1;
    local_78[5] = -dVar8 - local_78[4];
    uVar2 = 2;
  }
LAB_0010aaeb:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of real roots=",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x= ",3);
      poVar3 = std::ostream::_M_insert<double>(local_78[uVar4 + 4]);
      local_89 = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_89,1);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
    testEigen();
    unsigned int counts;
    double ce[4]= {1.87832,-0.0950376,-1.87832,-0.882024};
    unsigned int j=5;
    if(argc < j ) j=argc;
    for(unsigned int i=1; i< j; i++) {
        ce[i-1]=strtod(argv[i],NULL);
    }
    std::cout<<"x^4";
    if(argc == 1) j=4;
    else j--;
    for(unsigned int i=0; i< j; i++) {
        std::cout<<" + ("<<ce[i]<<")";
        if ( i != 3 ) {
            std::cout<<"*x^"<<3-i;
        } else {
            std::cout<<" =0\n";
        }
    }

    double roots[4];
    switch (j) {
    case 4:
        std::cout<<"quadratic:\n";
        counts=quarticSolver(ce,roots);
        break;
    case 3:
        std::cout<<"cubic:\n";
        counts=cubicSolver(ce,roots);
        break;
    default:
        std::cout<<"quartic:\n";
        counts=quadraticSolver(ce,roots);
    }
    std::cout<<"Number of real roots="<<counts<<std::endl;
    for(unsigned int i=0; i<counts; i++) {
        std::cout<<"x= "<<roots[i]<<'\t';
    }
    std::cout<<std::endl;
    return 0;


}